

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O2

void ncnn::cubic_interp1d(float *coeffs0,float *coeffs1,float *coeffs2,float *coeffs3,float fx)

{
  float fVar1;
  float fVar2;
  
  fVar1 = fx + 1.0;
  fVar2 = 1.0 - fx;
  *coeffs0 = fVar1 * -6.0 + 3.0 + fVar1 * fVar1 * (fVar1 * -0.75 + 3.75);
  *coeffs1 = fx * fx * (fx * 1.25 + -2.25) + 1.0;
  fVar1 = (fVar2 * 1.25 + -2.25) * fVar2 * fVar2;
  *coeffs2 = fVar1 + 1.0;
  *coeffs3 = -(fVar1 + *coeffs0 + *coeffs1);
  return;
}

Assistant:

static inline void cubic_interp1d(float& coeffs0, float& coeffs1, float& coeffs2, float& coeffs3, float fx)
{
    const float A = -0.75f;

    float fx0 = fx + 1;
    float fx1 = fx;
    float fx2 = 1 - fx;
    // float fx3 = 2 - fx;

    coeffs0 = A * fx0 * fx0 * fx0 - 5 * A * fx0 * fx0 + 8 * A * fx0 - 4 * A;
    coeffs1 = (A + 2) * fx1 * fx1 * fx1 - (A + 3) * fx1 * fx1 + 1;
    coeffs2 = (A + 2) * fx2 * fx2 * fx2 - (A + 3) * fx2 * fx2 + 1;
    coeffs3 = 1.f - coeffs0 - coeffs1 - coeffs2;
}